

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

int xmlPythonFileCloseRaw(void *context)

{
  PyObject *op;
  PyObject *ret;
  PyObject *file;
  void *context_local;
  
  if (context == (void *)0x0) {
    context_local._4_4_ = -1;
  }
  else {
    op = (PyObject *)_PyObject_CallMethod_SizeT(context,"close","()");
    if (op != (PyObject *)0x0) {
      _Py_DECREF(op);
    }
    _Py_DECREF((PyObject *)context);
    context_local._4_4_ = 0;
  }
  return context_local._4_4_;
}

Assistant:

static int
xmlPythonFileCloseRaw (void * context) {
    PyObject *file, *ret;

    file = (PyObject *) context;
    if (file == NULL) return(-1);
    ret = PyObject_CallMethod(file, (char *) "close", (char *) "()");
    if (ret != NULL) {
	Py_DECREF(ret);
    }
    Py_DECREF(file);
    return(0);
}